

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_92;
  allocator local_91;
  undefined1 local_90 [8];
  string mask;
  int bitInVarIndex;
  string local_60;
  undefined1 local_40 [8];
  string varName;
  int bitIndex_local;
  string *prefix_local;
  string *result;
  
  varName.field_2._12_4_ = bitIndex;
  GetBitFieldNameForBit_abi_cxx11_(&local_60,(java *)(ulong)(uint)bitIndex,bitIndex);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 prefix,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  mask.field_2._8_4_ = (int)varName.field_2._12_4_ % 0x20;
  pcVar1 = *(char **)(bit_masks + (long)(int)mask.field_2._8_4_ * 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_90,pcVar1,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_92 = 0;
  std::operator+(&local_138,"((",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(&local_118,&local_138," & ");
  std::operator+(&local_f8,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::operator+(&local_d8,&local_f8,") == ");
  std::operator+(&local_b8,&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::operator+(__return_storage_ptr__,&local_b8,")");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  local_92 = 1;
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string GenerateGetBitInternal(const string& prefix, int bitIndex) {
  string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  string mask = bit_masks[bitInVarIndex];
  string result = "((" + varName + " & " + mask + ") == " + mask + ")";
  return result;
}